

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test::
~IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test
          (IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test *this)

{
  IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test *this_local;
  
  ~IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, CanonicalizeTypesBeforeSubtyping) {
  TypeBuilder builder(6);
  // A rec group
  builder.createRecGroup(0, 2);
  builder[0] = Struct{};
  builder[1] = Struct{};
  builder[1].subTypeOf(builder[0]);

  // The same rec group again
  builder.createRecGroup(2, 2);
  builder[2] = Struct{};
  builder[3] = Struct{};
  builder[3].subTypeOf(builder[2]);

  // This subtyping only validates if the previous two groups are deduplicated
  // before checking subtype validity.
  builder[4] =
    Struct({Field(builder.getTempRefType(builder[0], Nullable), Immutable)});
  builder[5] =
    Struct({Field(builder.getTempRefType(builder[3], Nullable), Immutable)});
  builder[5].subTypeOf(builder[4]);

  auto result = builder.build();
  EXPECT_TRUE(result);
}